

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm_sse2.h
# Opt level: O2

void store_buffer_16bit_to_32bit_w8(__m128i *in,int32_t *out,int stride,int out_size)

{
  short *psVar1;
  undefined1 auVar2 [16];
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  ulong uVar7;
  ulong uVar8;
  int32_t *piVar9;
  
  uVar7 = 0;
  uVar8 = (ulong)(uint)out_size;
  if (out_size < 1) {
    uVar8 = uVar7;
  }
  piVar9 = out + 4;
  for (; uVar8 * 0x10 != uVar7; uVar7 = uVar7 + 0x10) {
    psVar1 = (short *)((long)*in + uVar7);
    sVar3 = psVar1[4];
    sVar4 = psVar1[5];
    sVar5 = psVar1[6];
    sVar6 = psVar1[7];
    auVar2._4_2_ = psVar1[1];
    auVar2._0_4_ = (int)*psVar1;
    auVar2._6_2_ = psVar1[1] >> 0xf;
    auVar2._8_2_ = psVar1[2];
    auVar2._10_2_ = psVar1[2] >> 0xf;
    auVar2._12_2_ = psVar1[3];
    auVar2._14_2_ = psVar1[3] >> 0xf;
    *(undefined1 (*) [16])(piVar9 + -4) = auVar2;
    *piVar9 = (int)sVar3;
    piVar9[1] = (int)sVar4;
    piVar9[2] = (int)sVar5;
    piVar9[3] = (int)sVar6;
    piVar9 = piVar9 + stride;
  }
  return;
}

Assistant:

static inline void store_buffer_16bit_to_32bit_w8(const __m128i *const in,
                                                  int32_t *const out,
                                                  const int stride,
                                                  const int out_size) {
  for (int i = 0; i < out_size; ++i) {
    store_16bit_to_32bit(in[i], out + i * stride);
  }
}